

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::MessageLite::AppendToString(MessageLite *this,string *output)

{
  bool bVar1;
  uint uVar2;
  LogMessage *pLVar3;
  MessageLite *message;
  LogFinisher local_8a;
  byte local_89;
  string local_88;
  byte local_51;
  LogMessage local_50;
  string *local_18;
  string *output_local;
  MessageLite *this_local;
  
  local_18 = output;
  output_local = (string *)this;
  uVar2 = (*this->_vptr_MessageLite[5])();
  local_51 = 0;
  local_89 = 0;
  if ((uVar2 & 1) == 0) {
    message = (MessageLite *)0x1ba;
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x1ba);
    local_51 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_50,"CHECK failed: IsInitialized(): ");
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_88,(_anonymous_namespace_ *)"serialize",(char *)this,message);
    local_89 = 1;
    pLVar3 = internal::LogMessage::operator<<(pLVar3,&local_88);
    internal::LogFinisher::operator=(&local_8a,pLVar3);
  }
  if ((local_89 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = AppendPartialToString(this,local_18);
  return bVar1;
}

Assistant:

bool MessageLite::AppendToString(std::string* output) const {
  GOOGLE_DCHECK(IsInitialized()) << InitializationErrorMessage("serialize", *this);
  return AppendPartialToString(output);
}